

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::~Molecule(Molecule *this)

{
  pointer ppSVar1;
  pointer ppAVar2;
  
  this->_vptr_Molecule = (_func_int **)&PTR__Molecule_00206670;
  Utils::deletePointers<std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>(&this->atoms_);
  Utils::deletePointers<std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>>(&this->bonds_);
  Utils::deletePointers<std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>>(&this->bends_);
  Utils::deletePointers<std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>>
            (&this->torsions_);
  Utils::deletePointers<std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>>
            (&this->inversions_);
  Utils::deletePointers<std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>>
            (&this->rigidBodies_);
  Utils::deletePointers<std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>>
            (&this->cutoffGroups_);
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>
            (&this->constraintPairs_);
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>>
            (&this->constraintElems_);
  Utils::
  deletePointers<std::vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>>
            (&this->hBondDonors_);
  ppSVar1 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->integrableObjects_).
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  ppAVar2 = (this->fluctuatingCharges_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->fluctuatingCharges_).
      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar2) {
    (this->fluctuatingCharges_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar2;
  }
  PropertyMap::~PropertyMap(&this->properties_);
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
            (&(this->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
  std::_Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
  ::~_Vector_base(&(this->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 );
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
            (&(this->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
  std::_Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::
  ~_Vector_base(&(this->constraintElems_).
                 super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
               );
  std::_Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::
  ~_Vector_base(&(this->constraintPairs_).
                 super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
               );
  std::_Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::~_Vector_base
            (&(this->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>);
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&(this->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  std::_Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::~_Vector_base
            (&(this->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>);
  std::_Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::~_Vector_base
            (&(this->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>);
  std::_Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::~_Vector_base
            (&(this->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>);
  std::_Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::~_Vector_base
            (&(this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>);
  std::_Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::~_Vector_base
            (&(this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>);
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
            (&(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
  return;
}

Assistant:

Molecule::~Molecule() {
    Utils::deletePointers(atoms_);
    Utils::deletePointers(bonds_);
    Utils::deletePointers(bends_);
    Utils::deletePointers(torsions_);
    Utils::deletePointers(inversions_);
    Utils::deletePointers(rigidBodies_);
    Utils::deletePointers(cutoffGroups_);
    Utils::deletePointers(constraintPairs_);
    Utils::deletePointers(constraintElems_);
    Utils::deletePointers(hBondDonors_);

    // integrableObjects_ don't own the objects
    integrableObjects_.clear();
    fluctuatingCharges_.clear();
  }